

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O3

QLayoutItem * __thiscall QDockAreaLayout::plug(QDockAreaLayout *this,QList<int> *path)

{
  Data *pDVar1;
  CutResult CVar2;
  QLayoutItem *pQVar3;
  QDockAreaLayoutInfo *this_00;
  long in_FS_OFFSET;
  QArrayData *d;
  qsizetype l;
  qsizetype p;
  QList<int> local_68;
  qsizetype local_48;
  qsizetype local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = this->docks + *(path->d).ptr;
  local_40 = 1;
  local_48 = -1;
  CVar2 = QtPrivate::QContainerImplHelper::mid((path->d).size,&local_40,&local_48);
  if (CVar2 < Full) {
    local_68.d.d = (Data *)0x0;
    local_68.d.ptr = (int *)0x0;
    local_68.d.size = 0;
    pQVar3 = QDockAreaLayoutInfo::plug(this_00,&local_68);
  }
  else {
    if (CVar2 == Full) {
      local_68.d.d = (path->d).d;
      local_68.d.ptr = (path->d).ptr;
      local_68.d.size = (path->d).size;
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
        super___atomic_base<int>._M_i =
             (((QArrayData *)&((local_68.d.d)->super_QArrayData).ref_)->ref_)._q_value.
             super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
    }
    else {
      local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_68.d.ptr =
           (int *)QArrayData::allocate((QArrayData **)&local_68,4,0x10,local_48,KeepSize);
      local_68.d.size = local_48;
      pDVar1 = local_68.d.d;
      if (local_48 != 0) {
        memcpy(local_68.d.ptr,(path->d).ptr + local_40,local_48 * 4);
      }
      local_68.d.d = pDVar1;
      if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
        LOCK();
        (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&pDVar1->super_QArrayData,4,0x10);
        }
      }
    }
    pDVar1 = local_68.d.d;
    pQVar3 = QDockAreaLayoutInfo::plug(this_00,&local_68);
    if (&pDVar1->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
      }
    }
  }
  QDockAreaLayoutInfo::reparentWidgets(this_00,&this->mainWindow->super_QWidget);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return pQVar3;
  }
  __stack_chk_fail();
}

Assistant:

QLayoutItem *QDockAreaLayout::plug(const QList<int> &path)
{
#if QT_CONFIG(tabbar)
    Q_ASSERT(!path.isEmpty());
    const int index = path.first();
    Q_ASSERT(index >= 0 && index < QInternal::DockCount);
    QLayoutItem *item = docks[index].plug(path.mid(1));
    docks[index].reparentWidgets(mainWindow);
    return item;
#else
    return nullptr;
#endif
}